

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_mpbe.c
# Opt level: O1

void gga_x_mpbe_init(xc_func_type *p)

{
  double dVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  xc_func_info_type *pxVar7;
  long extraout_RDX;
  long lVar8;
  long in_RSI;
  long *plVar9;
  long lVar10;
  long *in_R8;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double __x;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dStack_58;
  
  plVar9 = (long *)0x20;
  puVar5 = (undefined8 *)malloc(0x20);
  p->params = puVar5;
  pxVar7 = p->info;
  if (pxVar7->number != 0x7a) {
    gga_x_mpbe_init_cold_1();
    if (in_RSI != 0) {
      lVar4 = plVar9[1];
      lVar8 = 0;
      do {
        if ((int)lVar4 == 2) {
          lVar6 = (int)plVar9[9] * lVar8;
          dVar16 = *(double *)(extraout_RDX + lVar6 * 8) + *(double *)(extraout_RDX + 8 + lVar6 * 8)
          ;
        }
        else {
          dVar16 = *(double *)(extraout_RDX + (int)plVar9[9] * lVar8 * 8);
        }
        dVar1 = (double)plVar9[0x30];
        if (dVar1 <= dVar16) {
          auVar22._8_8_ = (double)plVar9[0x32] * (double)plVar9[0x32];
          auVar22._0_8_ = dVar1;
          auVar21._8_8_ = pxVar7->refs[*(int *)((long)plVar9 + 0x4c) * lVar8 + -3];
          auVar21._0_8_ = *(undefined8 *)(extraout_RDX + (int)plVar9[9] * lVar8 * 8);
          auVar22 = maxpd(auVar21,auVar22);
          __x = auVar22._0_8_;
          dVar16 = 0.0;
          if (dVar1 < __x * 0.5) {
            dVar16 = (double)plVar9[0x31];
            dVar1 = (double)(-(ulong)(dVar16 < 1.0) & 0x3ff0000000000000 |
                            ~-(ulong)(dVar16 < 1.0) & (ulong)(dVar16 + -1.0 + 1.0));
            uVar11 = -(ulong)(dVar1 <= dVar16);
            dVar1 = (double)(uVar11 & (ulong)dVar16 | ~uVar11 & (ulong)dVar1);
            dVar12 = cbrt(dVar1);
            pdVar2 = (double *)plVar9[0x2f];
            dVar16 = pdVar2[1];
            dVar13 = cbrt(9.869604401089358);
            dVar19 = 1.0 / (dVar13 * dVar13);
            dVar14 = cbrt(__x);
            auVar17._0_8_ = 1.0 / dVar14;
            dStack_58 = auVar22._8_8_;
            dVar20 = (1.0 / (dVar14 * dVar14)) / (__x * __x);
            dVar23 = __x * __x * __x * __x;
            auVar17._8_8_ = 0x3ff0000000000000;
            dVar15 = (*pdVar2 * 1.8171205928321397 * dVar19 * dStack_58 * 1.5874010519681996 *
                     dVar20) / 24.0 + 1.0;
            auVar3._8_8_ = dVar15 * dVar15;
            auVar3._0_8_ = dVar23 * __x;
            auVar22 = divpd(auVar17,auVar3);
            auVar18._0_8_ =
                 (1.0 / dVar15) *
                 dVar20 * dStack_58 * 1.5874010519681996 * dVar16 * 1.8171205928321397 * dVar19;
            auVar18._8_8_ =
                 auVar22._8_8_ * auVar22._0_8_ *
                 dStack_58 * dStack_58 * 1.2599210498948732 *
                 pdVar2[2] * 3.3019272488946267 * ((1.0 / dVar13) / 9.869604401089358);
            auVar22 = divpd(auVar18,_DAT_00f791b0);
            dVar16 = dVar12 * dVar1 * dVar14 * -0.36927938319101117 *
                     (((1.0 / (dVar15 * dVar15 * dVar15)) *
                      pdVar2[3] * 0.010265982254684336 * dStack_58 * dStack_58 * dStack_58 *
                      (1.0 / (dVar23 * dVar23))) / 576.0 + auVar22._8_8_ + auVar22._0_8_ + 1.0);
            dVar16 = dVar16 + dVar16;
          }
          lVar6 = *in_R8;
          if ((lVar6 != 0) && ((*(byte *)(*plVar9 + 0x40) & 1) != 0)) {
            lVar10 = (int)plVar9[0xb] * lVar8;
            *(double *)(lVar6 + lVar10 * 8) = dVar16 + *(double *)(lVar6 + lVar10 * 8);
          }
        }
        lVar8 = lVar8 + 1;
      } while (in_RSI != lVar8);
    }
    return;
  }
  *puVar5 = 0x3fc4189374bc6a7f;
  puVar5[1] = 0x3fcc18e757928e0d;
  puVar5[2] = 0xbf8eb851eb851eb8;
  puVar5[3] = 0;
  return;
}

Assistant:

static void
gga_x_mpbe_init(xc_func_type *p)
{
  gga_x_mpbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_mpbe_params));
  params = (gga_x_mpbe_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_MPBE:
    params->a  =  0.157;
    params->c1 =  0.21951;
    params->c2 = -0.015;
    params->c3 =  0.0;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_mpbe\n");
    exit(1);
  }
}